

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O2

void __thiscall CS248::OSDText::~OSDText(OSDText *this)

{
  operator_delete(this->ft);
  operator_delete(this->face);
  if (this->font != (char *)0x0) {
    operator_delete__(this->font);
  }
  std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::clear(&this->lines);
  (*__glewDeleteProgram)(this->program);
  std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::~vector(&this->lines);
  return;
}

Assistant:

OSDText::~OSDText() {

  delete ft;
  delete face;
  delete [] font;

  lines.clear();

  glDeleteProgram(program);
}